

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_output_chain.c
# Opt level: O0

ngx_int_t ngx_output_chain_align_file_buf(ngx_output_chain_ctx_t *ctx,off_t bsize)

{
  long lVar1;
  ngx_buf_t *pnVar2;
  ngx_buf_t *in;
  size_t size;
  off_t bsize_local;
  ngx_output_chain_ctx_t *ctx_local;
  
  pnVar2 = ctx->in->buf;
  if ((pnVar2->file == (ngx_file_t *)0x0) || (((byte)pnVar2->file->field_0xc0 >> 1 & 1) == 0)) {
    ctx_local = (ngx_output_chain_ctx_t *)0xfffffffffffffffb;
  }
  else {
    ctx->field_0x20 = ctx->field_0x20 & 0xfd | 2;
    lVar1 = pnVar2->file_pos - (pnVar2->file_pos & (ctx->alignment - 1U ^ 0xffffffffffffffff));
    if (lVar1 == 0) {
      in = (ngx_buf_t *)bsize;
      if ((long)(ctx->bufs).size <= bsize) {
        return -5;
      }
    }
    else {
      in = (ngx_buf_t *)(ctx->alignment - lVar1);
      if (bsize < (long)in) {
        in = (ngx_buf_t *)bsize;
      }
    }
    pnVar2 = ngx_create_temp_buf(ctx->pool,(size_t)in);
    ctx->buf = pnVar2;
    if (ctx->buf == (ngx_buf_t *)0x0) {
      ctx_local = (ngx_output_chain_ctx_t *)0xffffffffffffffff;
    }
    else {
      ctx_local = (ngx_output_chain_ctx_t *)0x0;
    }
  }
  return (ngx_int_t)ctx_local;
}

Assistant:

static ngx_int_t
ngx_output_chain_align_file_buf(ngx_output_chain_ctx_t *ctx, off_t bsize)
{
    size_t      size;
    ngx_buf_t  *in;

    in = ctx->in->buf;

    if (in->file == NULL || !in->file->directio) {
        return NGX_DECLINED;
    }

    ctx->directio = 1;

    size = (size_t) (in->file_pos - (in->file_pos & ~(ctx->alignment - 1)));

    if (size == 0) {

        if (bsize >= (off_t) ctx->bufs.size) {
            return NGX_DECLINED;
        }

        size = (size_t) bsize;

    } else {
        size = (size_t) ctx->alignment - size;

        if ((off_t) size > bsize) {
            size = (size_t) bsize;
        }
    }

    ctx->buf = ngx_create_temp_buf(ctx->pool, size);
    if (ctx->buf == NULL) {
        return NGX_ERROR;
    }

    /*
     * we do not set ctx->buf->tag, because we do not want
     * to reuse the buf via ctx->free list
     */

#if (NGX_HAVE_ALIGNED_DIRECTIO)
    ctx->unaligned = 1;
#endif

    return NGX_OK;
}